

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderErrorCode HuffmanTreeGroupDecode(HuffmanTreeGroup *group,BrotliDecoderStateInternal *s)

{
  BrotliDecoderErrorCode BVar1;
  uint local_2c;
  BrotliDecoderErrorCode result;
  uint32_t table_size;
  BrotliMetablockHeaderArena *h;
  BrotliDecoderStateInternal *s_local;
  HuffmanTreeGroup *group_local;
  
  _result = &s->arena;
  h = (BrotliMetablockHeaderArena *)s;
  s_local = (BrotliDecoderStateInternal *)group;
  if ((_result->header).substate_tree_group != BROTLI_STATE_TREE_GROUP_LOOP) {
    (s->arena).header.next = group->codes;
    (s->arena).header.htree_index = 0;
    (_result->header).substate_tree_group = BROTLI_STATE_TREE_GROUP_LOOP;
  }
  while( true ) {
    if ((int)(uint)*(ushort *)&(s_local->br).field_0xc <= (_result->header).htree_index) {
      (_result->header).substate_tree_group = BROTLI_STATE_TREE_GROUP_NONE;
      return BROTLI_DECODER_SUCCESS;
    }
    BVar1 = ReadHuffmanCode((uint)(ushort)(s_local->br).bit_pos_,
                            (uint)*(ushort *)((long)&(s_local->br).bit_pos_ + 2),
                            (_result->header).next,&local_2c,(BrotliDecoderStateInternal *)h);
    if (BVar1 != BROTLI_DECODER_SUCCESS) break;
    *(HuffmanCode **)(*(long *)s_local + (long)(_result->header).htree_index * 8) =
         (_result->header).next;
    (_result->header).next = (_result->header).next + local_2c;
    (_result->header).htree_index = (_result->header).htree_index + 1;
  }
  return BVar1;
}

Assistant:

static BrotliDecoderErrorCode HuffmanTreeGroupDecode(
    HuffmanTreeGroup* group, BrotliDecoderState* s) {
  BrotliMetablockHeaderArena* h = &s->arena.header;
  if (h->substate_tree_group != BROTLI_STATE_TREE_GROUP_LOOP) {
    h->next = group->codes;
    h->htree_index = 0;
    h->substate_tree_group = BROTLI_STATE_TREE_GROUP_LOOP;
  }
  while (h->htree_index < group->num_htrees) {
    uint32_t table_size;
    BrotliDecoderErrorCode result = ReadHuffmanCode(group->alphabet_size_max,
        group->alphabet_size_limit, h->next, &table_size, s);
    if (result != BROTLI_DECODER_SUCCESS) return result;
    group->htrees[h->htree_index] = h->next;
    h->next += table_size;
    ++h->htree_index;
  }
  h->substate_tree_group = BROTLI_STATE_TREE_GROUP_NONE;
  return BROTLI_DECODER_SUCCESS;
}